

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrappingRefUse(TranslateToFuzzReader *this,HeapType type)

{
  Type local_40;
  Type nonNull;
  Type local_30;
  Index local_24;
  TranslateToFuzzReader *pTStack_20;
  Index percent;
  TranslateToFuzzReader *this_local;
  HeapType type_local;
  
  pTStack_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_24 = upTo(this,100);
  if (local_24 < 5) {
    nonNull.id = (uintptr_t)this_local;
    Type::Type(&local_30,(HeapType)this_local,Nullable,Inexact);
    type_local.id = (uintptr_t)make(this,local_30);
  }
  else {
    Type::Type(&local_40,(HeapType)this_local,NonNullable,Inexact);
    if ((local_24 < 0x46) || (this->funcContext == (FunctionCreationContext *)0x0)) {
      type_local.id = (uintptr_t)make(this,local_40);
    }
    else {
      type_local.id = (uintptr_t)makeLocalGet(this,local_40);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrappingRefUse(HeapType type) {
  auto percent = upTo(100);
  // Only give a low probability to emit a nullable reference.
  if (percent < 5) {
    return make(Type(type, Nullable));
  }
  // Otherwise, usually emit a non-nullable one.
  auto nonNull = Type(type, NonNullable);
  if (percent < 70 || !funcContext) {
    return make(nonNull);
  }
  // With significant probability, try to use an existing value, that is, to
  // get a value using local.get, as it is better to have patterns like this:
  //
  //  (local.set $ref (struct.new $..
  //  (struct.get (local.get $ref))
  //
  // Rather than constantly operating on new data each time:
  //
  //  (local.set $ref (struct.new $..
  //  (struct.get (struct.new $..
  //
  // By using local values more, we get more coverage of interesting sequences
  // of reads and writes to the same objects.
  //
  // Note that makeLocalGet will add a local if necessary, and even tee that
  // value so it is usable later as well.
  return makeLocalGet(nonNull);
}